

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O2

RC __thiscall QL_NodeSel::GetNextRec(QL_NodeSel *this,RM_Record *rec)

{
  int iVar1;
  RC RVar2;
  char *pData;
  char *local_20;
  
  while( true ) {
    iVar1 = (*this->prevNode->_vptr_QL_Node[2])(this->prevNode,rec);
    if (iVar1 != 0) {
      return iVar1;
    }
    RVar2 = RM_Record::GetData(rec,&local_20);
    if (RVar2 != 0) break;
    RVar2 = QL_Node::CheckConditions(&this->super_QL_Node,local_20);
    if (RVar2 == 0) {
      return 0;
    }
  }
  return RVar2;
}

Assistant:

RC QL_NodeSel::GetNextRec(RM_Record &rec){
  RC rc = 0;
  while(true){
    if((rc = prevNode.GetNextRec(rec)))
      return (rc);

    char *pData;
    if((rc = rec.GetData(pData)))
      return (rc);

    RC cond = CheckConditions(pData);
    if(cond ==0)
      break;
  }

  return (0);
}